

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::compare_round_equals(float val1,float val2)

{
  int iVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = val1 - val2;
  bVar3 = true;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    iVar1 = std::fpclassify(fVar4);
    if (iVar1 != 3) {
      fVar4 = (float)((int)val1 + 8U & 0xfffffff0);
      fVar5 = (float)((int)val2 + 8U & 0xfffffff0);
      if ((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) {
        fVar2 = (float)((int)(val2 * 1.0000005) + 8U & 0xfffffff0);
        if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
          fVar2 = (float)((int)(val2 * 0.9999995) + 8U & 0xfffffff0);
          if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
            fVar4 = (float)((int)(val1 * 1.0000005) + 8U & 0xfffffff0);
            if ((fVar5 != fVar4) || (NAN(fVar5) || NAN(fVar4))) {
              bVar3 = (bool)(-(fVar5 == (float)((int)(val1 * 0.9999995) + 8U & 0xfffffff0)) & 1);
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

inline bool compare_round_equals(float val1, float val2)
    {
        static constexpr float half_precision{5e-7F};
        auto v1 = val1 - val2;
        if (v1 == 0.0F || std::fpclassify(v1) == FP_SUBNORMAL) {
            return true;
        }
        auto c1 = cround(val1);
        auto c2 = cround(val2);
        // yes these are magic numbers half the value of specified precision of
        // 1e-6 for units
        return (c1 == c2) || (cround(val2 * (1.0F + half_precision)) == c1) ||
            (cround(val2 * (1.0F - half_precision)) == c1) ||
            (cround(val1 * (1.0F + half_precision)) == c2) ||
            (cround(val1 * (1.0F - half_precision)) == c2);
    }